

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O2

int nva_init(void)

{
  uint uVar1;
  long lVar2;
  nva_card *pnVar3;
  nva_card *pnVar4;
  int iVar5;
  long lVar6;
  pci_device *ppVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  pci_id_match nv01_match;
  pci_id_match nv_sgs_match;
  pci_id_match nv_match;
  
  iVar5 = pci_system_init();
  if (iVar5 == 0) {
    lVar6 = pci_id_match_iterator_create();
    if (lVar6 != 0) {
      while( true ) {
        ppVar7 = (pci_device *)pci_device_next(lVar6);
        if (ppVar7 == (pci_device *)0x0) break;
        iVar5 = pci_device_probe(ppVar7);
        if (iVar5 == 0) {
          iVar5 = nva_cardsnum;
          if (nva_cardsmax <= nva_cardsnum) {
            bVar10 = nva_cardsmax == 0;
            nva_cardsmax = nva_cardsmax * 2;
            if (bVar10) {
              nva_cardsmax = 0x10;
            }
            nva_cards = (nva_card *)realloc(nva_cards,(long)nva_cardsmax << 5);
            iVar5 = nva_cardsnum;
          }
          pnVar4 = nva_cards;
          nva_cardsnum = iVar5 + 1;
          nva_cards[iVar5].pci = ppVar7;
          pnVar3 = pnVar4 + iVar5;
          pnVar3->boot0 = 0;
          pnVar3->chipset = 0;
          *(undefined8 *)(&pnVar3->boot0 + 2) = 0;
          pnVar4[iVar5].bar0 = (void *)0x0;
        }
        else {
          fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)ppVar7->domain,
                  (ulong)ppVar7->bus,(ulong)ppVar7->dev,(ulong)ppVar7->func);
        }
      }
      pci_iterator_destroy(lVar6);
      lVar6 = pci_id_match_iterator_create();
      if (lVar6 != 0) {
        while (ppVar7 = (pci_device *)pci_device_next(lVar6), ppVar7 != (pci_device *)0x0) {
          iVar5 = pci_device_probe(ppVar7);
          if (iVar5 == 0) {
            iVar5 = nva_cardsnum;
            if (nva_cardsmax <= nva_cardsnum) {
              iVar5 = nva_cardsmax * 2;
              if (nva_cardsmax == 0) {
                iVar5 = 0x10;
              }
              nva_cardsmax = iVar5;
              nva_cards = (nva_card *)realloc(nva_cards,(long)iVar5 << 5);
              iVar5 = nva_cardsnum;
            }
            pnVar4 = nva_cards;
            nva_cardsnum = iVar5 + 1;
            nva_cards[iVar5].pci = ppVar7;
            pnVar3 = pnVar4 + iVar5;
            pnVar3->boot0 = 0;
            pnVar3->chipset = 0;
            *(undefined8 *)(&pnVar3->boot0 + 2) = 0;
            pnVar4[iVar5].bar0 = (void *)0x0;
          }
          else {
            fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)ppVar7->domain,
                    (ulong)ppVar7->bus,(ulong)ppVar7->dev,(ulong)ppVar7->func);
          }
        }
        pci_iterator_destroy(lVar6);
        lVar6 = pci_id_match_iterator_create();
        if (lVar6 != 0) {
          while (ppVar7 = (pci_device *)pci_device_next(lVar6), ppVar7 != (pci_device *)0x0) {
            iVar5 = pci_device_probe(ppVar7);
            if (iVar5 == 0) {
              iVar5 = nva_cardsnum;
              if (nva_cardsmax <= nva_cardsnum) {
                bVar10 = nva_cardsmax == 0;
                nva_cardsmax = nva_cardsmax * 2;
                if (bVar10) {
                  nva_cardsmax = 0x10;
                }
                nva_cards = (nva_card *)realloc(nva_cards,(long)nva_cardsmax << 5);
                iVar5 = nva_cardsnum;
              }
              pnVar4 = nva_cards;
              nva_cardsnum = iVar5 + 1;
              nva_cards[iVar5].pci = ppVar7;
              pnVar3 = pnVar4 + iVar5;
              pnVar3->boot0 = 0;
              pnVar3->chipset = 0;
              *(undefined8 *)(&pnVar3->boot0 + 2) = 0;
              pnVar4[iVar5].bar0 = (void *)0x0;
            }
            else {
              fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)ppVar7->domain,
                      (ulong)ppVar7->bus,(ulong)ppVar7->dev,(ulong)ppVar7->func);
            }
          }
          pci_iterator_destroy(lVar6);
          lVar6 = 0x18;
          lVar9 = 0;
          do {
            if (nva_cardsnum <= lVar9) {
              return 0;
            }
            lVar2 = *(long *)((long)nva_cards + lVar6 + -0x18);
            iVar5 = pci_device_map_range
                              (lVar2,*(undefined8 *)(lVar2 + 0x28),*(undefined8 *)(lVar2 + 0x30),1,
                               (long)&nva_cards->pci + lVar6);
            pnVar3 = nva_cards;
            if (iVar5 == 0) {
              uVar1 = **(uint **)((long)&nva_cards->pci + lVar6);
              *(uint *)((long)nva_cards + lVar6 + -0x10) = uVar1;
              uVar8 = uVar1 >> 0x14 & 0xff;
              *(uint *)((long)pnVar3 + lVar6 + -0xc) = uVar8;
              if (uVar8 < 0x10) {
                if ((uVar1 & 0xf000) == 0) {
                  uVar8 = uVar1 >> 0x10 & 0xf;
                  *(uint *)((long)pnVar3 + lVar6 + -0xc) = uVar8;
                  if ((uVar1 & 0xe0) != 0) {
                    *(undefined4 *)((long)pnVar3 + lVar6 + -4) = 1;
                  }
                }
                else if ((uVar1 & 0xf00000) == 0) {
                  *(undefined4 *)((long)pnVar3 + lVar6 + -0xc) = 4;
                  uVar8 = 4;
                }
                else {
                  *(undefined4 *)((long)pnVar3 + lVar6 + -0xc) = 5;
                  uVar8 = 5;
                }
              }
              if ((*(short *)(lVar2 + 6) == 0x104a) && (*(short *)(lVar2 + 8) == 9)) {
                *(undefined4 *)((long)pnVar3 + lVar6 + -0xc) = 1;
                uVar8 = 1;
              }
              else if (3 < uVar8) {
                if (uVar8 < 0x10) {
                  *(undefined4 *)((long)pnVar3 + lVar6 + -8) = 4;
                }
                else if (uVar8 < 0x20) {
                  *(undefined4 *)((long)pnVar3 + lVar6 + -8) = 0x10;
                }
                else if (uVar8 < 0x30) {
                  *(undefined4 *)((long)pnVar3 + lVar6 + -8) = 0x20;
                }
                else if (uVar8 < 0x40) {
                  *(undefined4 *)((long)pnVar3 + lVar6 + -8) = 0x30;
                }
                else if (uVar8 < 0x50 || (uVar8 & 0xfffffff0) == 0x60) {
                  *(undefined4 *)((long)pnVar3 + lVar6 + -8) = 0x40;
                }
                else if (uVar8 < 0xc0) {
                  *(undefined4 *)((long)pnVar3 + lVar6 + -8) = 0x50;
                }
                else {
                  *(undefined4 *)((long)pnVar3 + lVar6 + -8) = 0xc0;
                }
                goto LAB_00101815;
              }
              *(uint *)((long)pnVar3 + lVar6 + -8) = uVar8;
            }
            else {
              fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",
                      (ulong)*(uint *)(lVar2 + 0x124),(ulong)*(byte *)(lVar2 + 2),
                      (ulong)*(byte *)(lVar2 + 3),(ulong)*(byte *)(lVar2 + 4));
            }
LAB_00101815:
            lVar9 = lVar9 + 1;
            lVar6 = lVar6 + 0x20;
          } while( true );
        }
      }
    }
    pci_system_cleanup();
  }
  return -1;
}

Assistant:

int nva_init() {
	int ret;
	ret = pci_system_init();
	if (ret)
		return -1;
	struct pci_id_match nv_match = {0x10de, PCI_MATCH_ANY, PCI_MATCH_ANY, PCI_MATCH_ANY, 0x30000, 0xffff0000};
	struct pci_device_iterator* it = pci_id_match_iterator_create(&nv_match);
	if (!it) {
		pci_system_cleanup();
		return -1;
	}

	struct pci_device *dev;
	while ((dev = pci_device_next(it))) {
		struct nva_card c = { 0 };
		ret = pci_device_probe(dev);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		c.pci = dev;
		ADDARRAY(nva_cards, c);
	}
	pci_iterator_destroy(it);

	struct pci_id_match nv_sgs_match = {0x12d2, PCI_MATCH_ANY, PCI_MATCH_ANY, PCI_MATCH_ANY, 0x30000, 0xffff0000};
	it = pci_id_match_iterator_create(&nv_sgs_match);
	if (!it) {
		pci_system_cleanup();
		return -1;
	}

	while ((dev = pci_device_next(it))) {
		struct nva_card c = { 0 };
		ret = pci_device_probe(dev);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		c.pci = dev;
		ADDARRAY(nva_cards, c);
	}
	pci_iterator_destroy(it);

	struct pci_id_match nv01_match = {0x104a, 0x0009, PCI_MATCH_ANY, PCI_MATCH_ANY, 0, 0};
	it = pci_id_match_iterator_create(&nv01_match);
	if (!it) {
		pci_system_cleanup();
		return -1;
	}

	while ((dev = pci_device_next(it))) {
		struct nva_card c = { 0 };
		ret = pci_device_probe(dev);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		c.pci = dev;
		ADDARRAY(nva_cards, c);
	}
	pci_iterator_destroy(it);

	int i;
	for (i = 0; i < nva_cardsnum; i++) {
		dev = nva_cards[i].pci;
		ret = pci_device_map_range(dev, dev->regions[0].base_addr, dev->regions[0].size, PCI_DEV_MAP_FLAG_WRITABLE, &nva_cards[i].bar0);
		if (ret) {
			fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
			continue;
		}
		nva_cards[i].boot0 = nva_rd32(i, 0);
		nva_cards[i].chipset = nva_cards[i].boot0 >> 20 & 0xff;
		if (nva_cards[i].chipset < 0x10) {
			if (nva_cards[i].boot0 & 0xf000) {
				if (nva_cards[i].boot0 & 0xf00000)
					nva_cards[i].chipset = 5;
				else
					nva_cards[i].chipset = 4;
			} else {
				nva_cards[i].chipset = nva_cards[i].boot0 >> 16 & 0xf;
				if ((nva_cards[i].boot0 & 0xff) >= 0x20)
					nva_cards[i].is_nv03p = 1;
			}
		}
		if (dev->vendor_id == 0x104a && dev->device_id == 0x0009)
			nva_cards[i].chipset = 0x01;

		if (nva_cards[i].chipset < 0x04)
			nva_cards[i].card_type = nva_cards[i].chipset;
		else if (nva_cards[i].chipset < 0x10)
			nva_cards[i].card_type = 0x04;
		else if (nva_cards[i].chipset < 0x20)
			nva_cards[i].card_type = 0x10;
		else if (nva_cards[i].chipset < 0x30)
			nva_cards[i].card_type = 0x20;
		else if (nva_cards[i].chipset < 0x40)
			nva_cards[i].card_type = 0x30;
		else if (nva_cards[i].chipset < 0x50 ||
			(nva_cards[i].chipset & 0xf0) == 0x60)
			nva_cards[i].card_type = 0x40;
		else if (nva_cards[i].chipset < 0xc0)
			nva_cards[i].card_type = 0x50;
		else
			nva_cards[i].card_type = 0xc0;
	}
	return 0;
}